

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

ecs_entity_t *
new_w_data(ecs_world_t *world,ecs_table_t *table,ecs_entities_t *component_ids,int32_t count,
          void **component_data,int32_t *row_out)

{
  short sVar1;
  short offset;
  ecs_entity_t entity;
  ecs_copy_t p_Var2;
  int32_t iVar3;
  int32_t iVar4;
  ecs_data_t *data_00;
  void *pvVar5;
  ecs_column_t *peVar6;
  void *pvVar7;
  ecs_c_info_t *peVar8;
  ecs_entity_t *peVar9;
  size_t sVar10;
  uint64_t *puVar11;
  ecs_entities_t eVar12;
  ecs_entity_t *entities;
  ecs_copy_t copy;
  ecs_c_info_t *cdata;
  void *src_ptr;
  void *ptr;
  int16_t alignment;
  int16_t size;
  ecs_column_t *column;
  int32_t table_index;
  ecs_entity_t c;
  ecs_table_t *peStack_b0;
  int32_t c_i;
  int local_a8;
  void *local_a0;
  ecs_record_t **record_ptrs;
  undefined1 auStack_90 [4];
  int i;
  ecs_entities_t added;
  int32_t row;
  ecs_data_t *data;
  ecs_entities_t component_array;
  ecs_type_t type;
  ecs_entity_t *ids;
  int32_t sparse_count;
  int32_t *row_out_local;
  void **component_data_local;
  ecs_entities_t *peStack_30;
  int32_t count_local;
  ecs_entities_t *component_ids_local;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  _ecs_assert(world != (ecs_world_t *)0x0,0xc,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x4e8);
  if (world == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x4e8,
                  "const ecs_entity_t *new_w_data(ecs_world_t *, ecs_table_t *, ecs_entities_t *, int32_t, void **, int32_t *)"
                 );
  }
  _ecs_assert(table != (ecs_table_t *)0x0,0xc,(char *)0x0,"table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x4e9);
  if (table == (ecs_table_t *)0x0) {
    __assert_fail("table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x4e9,
                  "const ecs_entity_t *new_w_data(ecs_world_t *, ecs_table_t *, ecs_entities_t *, int32_t, void **, int32_t *)"
                 );
  }
  _ecs_assert(count != 0,0xc,(char *)0x0,"count != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x4ea);
  if (count == 0) {
    __assert_fail("count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x4ea,
                  "const ecs_entity_t *new_w_data(ecs_world_t *, ecs_table_t *, ecs_entities_t *, int32_t, void **, int32_t *)"
                 );
  }
  iVar3 = ecs_sparse_count((world->store).entity_index);
  world_local = (ecs_world_t *)ecs_sparse_new_ids((world->store).entity_index,count);
  _ecs_assert(world_local != (ecs_world_t *)0x0,0xc,(char *)0x0,"ids != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x4ee);
  if (world_local == (ecs_world_t *)0x0) {
    __assert_fail("ids != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x4ee,
                  "const ecs_entity_t *new_w_data(ecs_world_t *, ecs_table_t *, ecs_entities_t *, int32_t, void **, int32_t *)"
                 );
  }
  component_array._8_8_ = table->type;
  if ((ecs_type_t)component_array._8_8_ != (ecs_type_t)0x0) {
    memset(&data,0,0x10);
    peStack_30 = component_ids;
    if (component_ids == (ecs_entities_t *)0x0) {
      peStack_30 = (ecs_entities_t *)&data;
      data = (ecs_data_t *)_ecs_vector_first((ecs_vector_t *)component_array._8_8_,8,0x10);
      component_array.array._0_4_ = ecs_vector_count((ecs_vector_t *)component_array._8_8_);
    }
    data_00 = ecs_table_get_or_create_data(table);
    added._12_4_ = ecs_table_appendn(world,table,data_00,count,(ecs_entity_t *)world_local);
    eVar12 = ecs_type_to_entities((ecs_type_t)component_array._8_8_);
    _auStack_90 = eVar12.array;
    added.array._0_4_ = eVar12.count;
    local_a0 = _ecs_vector_first(data_00->record_ptrs,8,0x10);
    for (record_ptrs._4_4_ = 0; record_ptrs._4_4_ < count; record_ptrs._4_4_ = record_ptrs._4_4_ + 1
        ) {
      local_a8 = added._12_4_ + record_ptrs._4_4_ + 1;
      peStack_b0 = table;
      pvVar5 = _ecs_sparse_set((world->store).entity_index,0x10,
                               *(uint64_t *)
                                ((long)world_local->c_info + (long)record_ptrs._4_4_ * 8 + -0x18),
                               &stack0xffffffffffffff50);
      *(void **)((long)local_a0 + (long)(added._12_4_ + record_ptrs._4_4_) * 8) = pvVar5;
    }
    ecs_defer_none(world,&world->stage);
    ecs_run_add_actions(world,table,data_00,added._12_4_,count,(ecs_entities_t *)auStack_90,true,
                        component_data == (void **)0x0);
    if (component_data != (void **)0x0) {
      for (c._4_4_ = 0; c._4_4_ < peStack_30->count; c._4_4_ = c._4_4_ + 1) {
        entity = peStack_30->array[c._4_4_];
        iVar4 = ecs_type_index_of((ecs_type_t)component_array._8_8_,entity);
        _ecs_assert(-1 < iVar4,0xc,(char *)0x0,"table_index >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x51a);
        if (iVar4 < 0) {
          __assert_fail("table_index >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x51a,
                        "const ecs_entity_t *new_w_data(ecs_world_t *, ecs_table_t *, ecs_entities_t *, int32_t, void **, int32_t *)"
                       );
        }
        if (iVar4 < table->column_count) {
          peVar6 = data_00->columns + iVar4;
          sVar1 = peVar6->size;
          offset = peVar6->alignment;
          if (offset < 0x10) {
            offset = 0x10;
          }
          pvVar7 = _ecs_vector_first(peVar6->data,(int)sVar1,offset);
          pvVar7 = (void *)((long)pvVar7 + (long)((int)sVar1 * added._12_4_));
          pvVar5 = component_data[c._4_4_];
          if (pvVar5 != (void *)0x0) {
            peVar8 = get_c_info(world,entity);
            if ((peVar8 == (ecs_c_info_t *)0x0) ||
               (p_Var2 = (peVar8->lifecycle).copy, p_Var2 == (ecs_copy_t)0x0)) {
              memcpy(pvVar7,pvVar5,(long)(sVar1 * count));
            }
            else {
              peVar9 = (ecs_entity_t *)_ecs_vector_first(data_00->entities,8,0x10);
              sVar10 = ecs_to_size_t((long)sVar1);
              (*p_Var2)(world,entity,peVar9,peVar9,pvVar7,pvVar5,sVar10,count,
                        (peVar8->lifecycle).ctx);
            }
          }
        }
      }
      ecs_run_set_systems(world,(ecs_entities_t *)auStack_90,table,data_00,added._12_4_,count,true);
    }
    ecs_run_monitors(world,table,table->monitors,added._12_4_,count,(ecs_vector_t *)0x0);
    ecs_defer_flush(world,&world->stage);
    if (row_out != (int32_t *)0x0) {
      *row_out = added._12_4_;
    }
    puVar11 = ecs_sparse_ids((world->store).entity_index);
    world_local = (ecs_world_t *)(puVar11 + iVar3);
  }
  return (ecs_entity_t *)world_local;
}

Assistant:

static
const ecs_entity_t* new_w_data(
    ecs_world_t * world,
    ecs_table_t * table,
    ecs_entities_t * component_ids,
    int32_t count,
    void ** component_data,
    int32_t * row_out)
{
    ecs_assert(world != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(table != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(count != 0, ECS_INTERNAL_ERROR, NULL);
    
    int32_t sparse_count = ecs_eis_count(world);
    const ecs_entity_t *ids = ecs_sparse_new_ids(world->store.entity_index, count);
    ecs_assert(ids != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_type_t type = table->type;   

    if (!type) {
        return ids;        
    }

    ecs_entities_t component_array = { 0 };
    if (!component_ids) {
        component_ids = &component_array;
        component_array.array = ecs_vector_first(type, ecs_entity_t);
        component_array.count = ecs_vector_count(type);
    }

    ecs_data_t *data = ecs_table_get_or_create_data(table);
    int32_t row = ecs_table_appendn(world, table, data, count, ids);
    ecs_entities_t added = ecs_type_to_entities(type);
    
    /* Update entity index. */
    int i;
    ecs_record_t **record_ptrs = ecs_vector_first(data->record_ptrs, ecs_record_t*);
    for (i = 0; i < count; i ++) { 
        record_ptrs[row + i] = ecs_eis_set(world, ids[i], 
        &(ecs_record_t){
            .table = table,
            .row = row + i + 1
        });
    }

    ecs_defer_none(world, &world->stage);

    ecs_run_add_actions(world, table, data, row, count, &added, 
        true, component_data == NULL);

    if (component_data) {
        /* Set components that we're setting in the component mask so the init
         * actions won't call OnSet triggers for them. This ensures we won't
         * call OnSet triggers multiple times for the same component */
        int32_t c_i;
        for (c_i = 0; c_i < component_ids->count; c_i ++) {
            ecs_entity_t c = component_ids->array[c_i];
            
            /* Bulk copy column data into new table */
            int32_t table_index = ecs_type_index_of(type, c);
            ecs_assert(table_index >= 0, ECS_INTERNAL_ERROR, NULL);
            if (table_index >= table->column_count) {
                continue;
            }

            ecs_column_t *column = &data->columns[table_index];
            int16_t size = column->size;
            int16_t alignment = column->alignment;
            void *ptr = ecs_vector_first_t(column->data, size, alignment);
            ptr = ECS_OFFSET(ptr, size * row);

            /* Copy component data */
            void *src_ptr = component_data[c_i];
            if (!src_ptr) {
                continue;
            }

            ecs_c_info_t *cdata = get_c_info(world, c);
            ecs_copy_t copy;
            if (cdata && (copy = cdata->lifecycle.copy)) {
                ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);
                copy(world, c, entities, entities, ptr, src_ptr, 
                    ecs_to_size_t(size), count, cdata->lifecycle.ctx);
            } else {
                ecs_os_memcpy(ptr, src_ptr, size * count);
            }
        };

        ecs_run_set_systems(world, &added, table, data, row, count, true);        
    }

    ecs_run_monitors(world, table, table->monitors, row, count, NULL);

    ecs_defer_flush(world, &world->stage);

    if (row_out) {
        *row_out = row;
    }

    ids = ecs_sparse_ids(world->store.entity_index);

    return &ids[sparse_count];
}